

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O1

void __thiscall
PSVIWriterHandlers::handleElementPSVI
          (PSVIWriterHandlers *this,XMLCh *param_1,XMLCh *param_2,PSVIElement *elementInfo)

{
  XSTypeDefinition *pXVar1;
  XMLCh *pXVar2;
  XMLCh *value;
  
  processActualValue(this,(PSVIItem *)elementInfo);
  processChildrenEnd(this);
  processSchemaInformation(this,*(XSModel **)(elementInfo + 0x60));
  value = (XMLCh *)&xercesc_4_0::PSVIUni::fgUnknown;
  pXVar2 = (XMLCh *)&xercesc_4_0::PSVIUni::fgUnknown;
  if ((ulong)*(uint *)(elementInfo + 0x34) < 3) {
    pXVar2 = (XMLCh *)(&PTR_fgNone_0011dd48)[*(uint *)(elementInfo + 0x34)];
  }
  sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgValidationAttempted,pXVar2);
  sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgValidationContext,
                   *(XMLCh **)(elementInfo + 0x10));
  if ((ulong)*(uint *)(elementInfo + 0x30) < 3) {
    value = (XMLCh *)(&PTR_fgNotKnown_0011dd60)[*(uint *)(elementInfo + 0x30)];
  }
  sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgValidity,value);
  sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSchemaErrorCode);
  sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSchemaNormalizedValue,
                   *(XMLCh **)(elementInfo + 0x18));
  sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgCanonicalRepresentation,
                   *(XMLCh **)(elementInfo + 0x28));
  if (elementInfo[0x38] == (PSVIElement)0x0) {
    pXVar2 = (XMLCh *)&xercesc_4_0::PSVIUni::fgInfoset;
  }
  else {
    pXVar2 = (XMLCh *)&xercesc_4_0::PSVIUni::fgSchema;
  }
  sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSchemaSpecified,pXVar2);
  sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSchemaDefault,
                   *(XMLCh **)(elementInfo + 0x20));
  pXVar1 = (XSTypeDefinition *)(**(code **)(*(long *)elementInfo + 0x10))(elementInfo);
  processTypeDefinitionRef(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgTypeDefinition,pXVar1);
  pXVar1 = (XSTypeDefinition *)(**(code **)(*(long *)elementInfo + 0x18))(elementInfo);
  processTypeDefinitionRef(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgMemberTypeDefinition,pXVar1);
  sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNil);
  processElementDeclarationRef
            (this,(XMLCh *)&xercesc_4_0::PSVIUni::fgDeclaration,
             *(XSElementDeclaration **)(elementInfo + 0x50));
  sendReference(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNotation,*(XSObject **)(elementInfo + 0x58));
  sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgIdIdrefTable);
  sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgIdentityConstraintTable);
  sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgElement);
  return;
}

Assistant:

void PSVIWriterHandlers::handleElementPSVI(	const XMLCh* const /* localName */,
											const XMLCh* const /* uri */,
											PSVIElement* elementInfo ) {

    processActualValue(elementInfo);
	processChildrenEnd();
	processSchemaInformation(elementInfo->getSchemaInformation());
	sendElementValue( PSVIUni::fgValidationAttempted,
		translateValidationAttempted(elementInfo->getValidationAttempted()));
	sendElementValue(PSVIUni::fgValidationContext, elementInfo->getValidationContext());
	sendElementValue(PSVIUni::fgValidity, translateValidity(elementInfo->getValidity()));
	//REVISIT errorCodes not supported
	//processSchemaErrorCode(elementInfo->getErrorCodes());
	sendElementEmpty(PSVIUni::fgSchemaErrorCode);
	sendElementValue(PSVIUni::fgSchemaNormalizedValue, elementInfo->getSchemaNormalizedValue());
	sendElementValue(PSVIUni::fgCanonicalRepresentation, elementInfo->getCanonicalRepresentation());
	sendElementValue(PSVIUni::fgSchemaSpecified,
		(elementInfo->getIsSchemaSpecified() ? PSVIUni::fgSchema : PSVIUni::fgInfoset));
	sendElementValue(PSVIUni::fgSchemaDefault, elementInfo->getSchemaDefault());
	processTypeDefinitionRef(PSVIUni::fgTypeDefinition, elementInfo->getTypeDefinition());
	processTypeDefinitionRef(PSVIUni::fgMemberTypeDefinition, elementInfo->getMemberTypeDefinition());
	sendElementEmpty(PSVIUni::fgNil);
	processElementDeclarationRef(PSVIUni::fgDeclaration, elementInfo->getElementDeclaration());
	sendReference(PSVIUni::fgNotation, elementInfo->getNotationDeclaration());
	sendElementEmpty(PSVIUni::fgIdIdrefTable);
	sendElementEmpty(PSVIUni::fgIdentityConstraintTable);
	sendUnindentedElement(PSVIUni::fgElement);

}